

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int extend_borders_mt(AV1_COMP *cpi,MULTI_THREADED_MODULES stage,int plane)

{
  int iVar1;
  AV1_COMMON *cm_00;
  int in_EDX;
  uint in_ESI;
  long *in_RDI;
  AV1_COMMON *cm;
  bool local_26;
  byte local_25;
  uint local_4;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  if (*(int *)((long)in_RDI + (ulong)in_ESI * 4 + 0x9ae4c) < 2) {
    local_4 = 0;
  }
  else if (in_ESI == 5) {
    local_4 = 0;
  }
  else if (in_ESI == 7) {
    iVar1 = is_cdef_used(cm_00);
    local_25 = 0;
    if ((iVar1 != 0) && (local_25 = 0, *(int *)(*in_RDI + 0x14dc4) == 0)) {
      iVar1 = is_restoration_used(cm_00);
      local_25 = 0;
      if (iVar1 == 0) {
        iVar1 = av1_superres_scaled(cm_00);
        local_25 = iVar1 != 0 ^ 0xff;
      }
    }
    local_4 = (uint)(local_25 & 1);
  }
  else if (in_ESI == 8) {
    iVar1 = is_restoration_used(cm_00);
    local_26 = false;
    if (iVar1 != 0) {
      local_26 = (int)in_RDI[(long)in_EDX * 8 + 0x8334] != 0;
    }
    local_4 = (uint)local_26;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int extend_borders_mt(const AV1_COMP *cpi,
                                    MULTI_THREADED_MODULES stage, int plane) {
  const AV1_COMMON *const cm = &cpi->common;
  if (cpi->mt_info.num_mod_workers[stage] < 2) return 0;
  switch (stage) {
    // TODO(deepa.kg@ittiam.com): When cdef and loop-restoration are disabled,
    // multi-thread frame border extension along with loop filter frame.
    // As loop-filtering of a superblock row modifies the pixels of the
    // above superblock row, border extension requires that loop filtering
    // of the current and above superblock row is complete.
    case MOD_LPF: return 0;
    case MOD_CDEF:
      return is_cdef_used(cm) && !cpi->ppi->rtc_ref.non_reference_frame &&
             !is_restoration_used(cm) && !av1_superres_scaled(cm);
    case MOD_LR:
      return is_restoration_used(cm) &&
             (cm->rst_info[plane].frame_restoration_type != RESTORE_NONE);
    default: assert(0);
  }
  return 0;
}